

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_collapse_rail.cpp
# Opt level: O3

void Omega_h::choose_rails
               (Mesh *mesh,LOs *cands2edges,Read<signed_char> *cand_edge_codes,
               Reals *cand_edge_quals,Read<signed_char> *verts_are_cands,Reals *vert_quals,
               Read<long> *vert_rails)

{
  int *piVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  Library *pLVar3;
  Alloc *pAVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Mesh *pMVar9;
  void *pvVar10;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var11;
  element_type *peVar12;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var13;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var14;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var15;
  Omega_h_Parting OVar16;
  LO LVar17;
  long lVar18;
  undefined8 uVar19;
  bool bVar20;
  Int ent_dim;
  char *pcVar21;
  long lVar22;
  uint uVar23;
  long lVar24;
  Alloc *pAVar25;
  Alloc *pAVar26;
  Library *pLVar27;
  Write<long> vert_rails_w;
  Write<double> vert_quals_w;
  Write<signed_char> verts_are_cands_w;
  Read<long> globals;
  Reals lengths;
  Read<signed_char> ve_codes;
  LOs ve2e;
  LOs v2ve;
  type f;
  LOs ev2v;
  Adj v2e;
  Alloc *local_420;
  element_type *local_418;
  Alloc *local_410;
  element_type *local_408;
  element_type *local_400;
  element_type *local_3f8;
  Alloc *local_3f0;
  element_type *local_3e8;
  element_type *local_3e0;
  Mesh *local_3d8;
  Alloc *local_3d0;
  Alloc *local_3c8;
  element_type *local_3c0;
  element_type *local_3b8;
  Alloc *local_3b0;
  Alloc *local_3a8;
  element_type *local_3a0;
  undefined1 local_398 [32];
  Alloc *local_378;
  element_type *local_370;
  Alloc *local_368;
  Alloc *local_360;
  Alloc *local_358;
  element_type *local_350;
  Alloc *local_348;
  element_type *local_340;
  element_type *local_338;
  element_type *local_330;
  element_type *local_328;
  Alloc *local_320;
  element_type *local_318;
  Alloc *local_310;
  element_type *local_308;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_300;
  Alloc *local_2f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2f0;
  Write<long> local_2e0;
  Write<double> local_2d0;
  Write<signed_char> local_2c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2b0;
  LOs local_2a8;
  Alloc *local_298;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_290;
  Write<long> local_288;
  Alloc *local_278;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_270;
  Write<double> local_268;
  Alloc *local_258;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_250;
  Write<signed_char> local_248;
  Alloc *local_238;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_230;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_228;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_220;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_218;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_210;
  Alloc *local_208;
  Alloc *local_200;
  Alloc *local_1f8;
  element_type *local_1f0;
  Alloc *local_1e8;
  element_type *peStack_1e0;
  Alloc *local_1d8;
  Alloc *pAStack_1d0;
  Alloc *local_1c8;
  element_type *peStack_1c0;
  Alloc *local_1b8;
  Alloc *pAStack_1b0;
  Alloc *local_1a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1a0;
  Alloc *local_198;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_190;
  element_type *local_188;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_180;
  element_type *local_178;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_170;
  element_type *local_168;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_160;
  element_type *local_158;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_150;
  Alloc *local_148;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_140;
  element_type *local_138;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_130;
  Alloc *local_128;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_120;
  element_type *local_118;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_110;
  Alloc *local_108;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_100;
  element_type *local_f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f0;
  Alloc *local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e0;
  element_type *local_d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d0;
  element_type *local_c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c0;
  element_type *local_b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b0;
  Alloc *local_a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  Alloc *local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  Alloc *local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  Alloc *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  Adj local_60;
  
  local_3e8 = (element_type *)cand_edge_codes;
  local_130._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)verts_are_cands;
  OVar16 = Mesh::parting(mesh);
  if (OVar16 != OMEGA_H_GHOSTED) {
    fail("assertion %s failed at %s +%d\n","mesh->parting() == OMEGA_H_GHOSTED",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_collapse_rail.cpp"
         ,0x12);
  }
  local_2a8.write_.shared_alloc_.alloc = (cands2edges->write_).shared_alloc_.alloc;
  if (((ulong)local_2a8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_2a8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_2a8.write_.shared_alloc_.alloc =
           (Alloc *)((local_2a8.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_2a8.write_.shared_alloc_.alloc)->use_count =
           (local_2a8.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_2a8.write_.shared_alloc_.direct_ptr = (cands2edges->write_).shared_alloc_.direct_ptr;
  LVar17 = Mesh::nedges(mesh);
  invert_injective_map((Omega_h *)&local_420,&local_2a8,LVar17);
  pAVar26 = local_2a8.write_.shared_alloc_.alloc;
  if (((ulong)local_2a8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_2a8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_2a8.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_2a8.write_.shared_alloc_.alloc);
      operator_delete(pAVar26,0x48);
    }
  }
  local_3f0 = (Alloc *)cand_edge_quals;
  Mesh::ask_up(&local_60,mesh,0,1);
  local_1f8 = local_60.super_Graph.a2ab.write_.shared_alloc_.alloc;
  if (((ulong)local_60.super_Graph.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.super_Graph.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1f8 = (Alloc *)((long)(local_60.super_Graph.a2ab.write_.shared_alloc_.alloc)->size * 8 +
                           1);
    }
    else {
      *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)local_60.super_Graph.a2ab.write_.shared_alloc_.alloc + 0x30))->
               _vptr__Sp_counted_base =
           *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)local_60.super_Graph.a2ab.write_.shared_alloc_.alloc + 0x30))->
                    _vptr__Sp_counted_base + 1;
    }
  }
  pAVar26 = local_1f8;
  local_3c0 = (element_type *)local_60.super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
  local_1f0 = (element_type *)local_60.super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
  local_208 = local_60.super_Graph.ab2b.write_.shared_alloc_.alloc;
  if (((ulong)local_60.super_Graph.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.super_Graph.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_208 = (Alloc *)((long)(local_60.super_Graph.ab2b.write_.shared_alloc_.alloc)->size * 8 +
                           1);
    }
    else {
      *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)local_60.super_Graph.ab2b.write_.shared_alloc_.alloc + 0x30))->
               _vptr__Sp_counted_base =
           *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)local_60.super_Graph.ab2b.write_.shared_alloc_.alloc + 0x30))->
                    _vptr__Sp_counted_base + 1;
    }
  }
  local_3c8 = (Alloc *)local_60.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
  local_200 = (Alloc *)local_60.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
  local_218._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60.codes.write_.shared_alloc_.alloc;
  if (((ulong)local_60.codes.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.codes.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_218._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((long)(local_60.codes.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)local_60.codes.write_.shared_alloc_.alloc + 0x30))->_vptr__Sp_counted_base =
           *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)local_60.codes.write_.shared_alloc_.alloc + 0x30))->
                    _vptr__Sp_counted_base + 1;
    }
  }
  _Var11._M_pi = local_218._M_pi;
  local_3d0 = (Alloc *)local_60.codes.write_.shared_alloc_.direct_ptr;
  local_210._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_60.codes.write_.shared_alloc_.direct_ptr;
  local_400 = (element_type *)local_208;
  Mesh::ask_verts_of((Mesh *)&local_70,(Int)mesh);
  Mesh::ask_lengths((Mesh *)&local_228);
  Mesh::globals((Mesh *)&local_238,(Int)mesh);
  local_3d8 = mesh;
  local_138 = (element_type *)vert_quals;
  LVar17 = Mesh::nverts(mesh);
  pAVar25 = (Alloc *)(local_398 + 0x10);
  local_398._0_8_ = pAVar25;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"");
  Write<signed_char>::Write(&local_2c0,LVar17,(string *)local_398);
  if ((Alloc *)local_398._0_8_ != pAVar25) {
    operator_delete((void *)local_398._0_8_,(ulong)(local_398._16_8_ + 1));
  }
  LVar17 = Mesh::nverts(local_3d8);
  local_398._0_8_ = pAVar25;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"");
  Write<double>::Write(&local_2d0,LVar17,(string *)local_398);
  if ((Alloc *)local_398._0_8_ != pAVar25) {
    operator_delete((void *)local_398._0_8_,(ulong)(local_398._16_8_ + 1));
  }
  LVar17 = Mesh::nverts(local_3d8);
  local_398._0_8_ = pAVar25;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"");
  Write<long>::Write(&local_2e0,LVar17,(string *)local_398);
  if ((Alloc *)local_398._0_8_ != pAVar25) {
    operator_delete((void *)local_398._0_8_,(ulong)(local_398._16_8_ + 1));
  }
  pvVar10 = local_2c0.shared_alloc_.direct_ptr;
  local_120._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pAVar26;
  if (((ulong)pAVar26 & 7) == 0 && pAVar26 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_120._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(pAVar26->size * 8 + 1);
    }
    else {
      pAVar26->use_count = pAVar26->use_count + 1;
    }
  }
  local_118 = local_3c0;
  local_110._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_400;
  if (((ulong)local_400 & 7) == 0 && local_400 != (element_type *)0x0) {
    if (entering_parallel == '\x01') {
      local_110._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_400->library_ * 8 + 1);
    }
    else {
      *(int *)((long)local_400 + 0x30) = *(int *)((long)local_400 + 0x30) + 1;
    }
  }
  _Var13._M_pi = local_110._M_pi;
  local_108 = local_3c8;
  local_100._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_420;
  if (((ulong)local_420 & 7) == 0 && local_420 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_100._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_420->size * 8 + 1);
    }
    else {
      local_420->use_count = local_420->use_count + 1;
    }
  }
  local_f8 = local_418;
  local_f0._M_pi = _Var11._M_pi;
  if (((ulong)_Var11._M_pi & 7) == 0 && (Alloc *)_Var11._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_f0._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((long)(_Var11._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    else {
      *(int *)&_Var11._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&_Var11._M_pi[3]._vptr__Sp_counted_base + 1;
    }
  }
  _Var11._M_pi = local_f0._M_pi;
  local_e8 = local_3d0;
  local_e0._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       (((Write<signed_char> *)&local_3e8->super_Graph)->shared_alloc_).alloc;
  if (((ulong)local_e0._M_pi & 7) == 0 && (Alloc *)local_e0._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_e0._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(((Alloc *)local_e0._M_pi)->size * 8 + 1)
      ;
    }
    else {
      ((Alloc *)local_e0._M_pi)->use_count = ((Alloc *)local_e0._M_pi)->use_count + 1;
    }
  }
  _Var14._M_pi = local_e0._M_pi;
  local_3e8 = (element_type *)
              (((Write<signed_char> *)&local_3e8->super_Graph)->shared_alloc_).direct_ptr;
  local_d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238;
  if (((ulong)local_238 & 7) == 0 && local_238 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_238->size * 8 + 1);
    }
    else {
      local_238->use_count = local_238->use_count + 1;
    }
  }
  _Var15._M_pi = local_d0._M_pi;
  local_400 = (element_type *)local_230._M_pi;
  local_c8 = (element_type *)local_230._M_pi;
  local_c0._M_pi = local_228._M_pi;
  if (((ulong)local_228._M_pi & 7) == 0 && (Alloc *)local_228._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_c0._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((long)(local_228._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    else {
      *(int *)&local_228._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_228._M_pi[3]._vptr__Sp_counted_base + 1;
    }
  }
  local_3a0 = (element_type *)local_220._M_pi;
  local_b8 = (element_type *)local_220._M_pi;
  local_b0._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       (((Write<double> *)&local_3f0->size)->shared_alloc_).alloc;
  if (((ulong)local_b0._M_pi & 7) == 0 && (Alloc *)local_b0._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_b0._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(((Alloc *)local_b0._M_pi)->size * 8 + 1)
      ;
    }
    else {
      ((Alloc *)local_b0._M_pi)->use_count = ((Alloc *)local_b0._M_pi)->use_count + 1;
    }
  }
  local_3f0 = (Alloc *)(((Write<double> *)&local_3f0->size)->shared_alloc_).direct_ptr;
  local_a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c0.shared_alloc_.alloc;
  if (((ulong)local_2c0.shared_alloc_.alloc & 7) == 0 &&
      local_2c0.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_a0._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((long)(local_2c0.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)local_2c0.shared_alloc_.alloc + 0x30))->_vptr__Sp_counted_base =
           *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)local_2c0.shared_alloc_.alloc + 0x30))->_vptr__Sp_counted_base + 1;
    }
  }
  local_98 = (Alloc *)local_2c0.shared_alloc_.direct_ptr;
  local_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d0.shared_alloc_.alloc;
  if (((ulong)local_2d0.shared_alloc_.alloc & 7) == 0 &&
      local_2d0.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_90._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((long)(local_2d0.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)local_2d0.shared_alloc_.alloc + 0x30))->_vptr__Sp_counted_base =
           *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)local_2d0.shared_alloc_.alloc + 0x30))->_vptr__Sp_counted_base + 1;
    }
  }
  local_3a8 = (Alloc *)local_2d0.shared_alloc_.direct_ptr;
  local_88 = (Alloc *)local_2d0.shared_alloc_.direct_ptr;
  local_80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e0.shared_alloc_.alloc;
  if (((ulong)local_2e0.shared_alloc_.alloc & 7) == 0 &&
      local_2e0.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_80._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((long)(local_2e0.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)local_2e0.shared_alloc_.alloc + 0x30))->_vptr__Sp_counted_base =
           *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)local_2e0.shared_alloc_.alloc + 0x30))->_vptr__Sp_counted_base + 1;
    }
  }
  local_3b0 = (Alloc *)local_2e0.shared_alloc_.direct_ptr;
  local_78 = (Alloc *)local_2e0.shared_alloc_.direct_ptr;
  local_410 = (Alloc *)local_80._M_pi;
  local_408 = (element_type *)local_90._M_pi;
  local_3f8 = (element_type *)local_b0._M_pi;
  local_3e0 = (element_type *)local_c0._M_pi;
  local_3b8 = (element_type *)local_a0._M_pi;
  local_2b0._M_pi = local_100._M_pi;
  local_128 = (Alloc *)local_120._M_pi;
  local_d8 = local_3e8;
  local_a8 = local_3f0;
  LVar17 = Mesh::nverts(local_3d8);
  local_1e8 = local_128;
  if (((ulong)local_128 & 7) == 0 && local_128 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1e8 = (Alloc *)(local_128->size * 8 + 1);
    }
    else {
      local_128->use_count = local_128->use_count + 1;
    }
  }
  peStack_1e0 = local_3c0;
  local_1d8 = (Alloc *)_Var13._M_pi;
  if (((ulong)_Var13._M_pi & 7) == 0 && (Alloc *)_Var13._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1d8 = (Alloc *)((long)(_Var13._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    else {
      *(int *)&_Var13._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&_Var13._M_pi[3]._vptr__Sp_counted_base + 1;
    }
  }
  pAStack_1d0 = local_3c8;
  local_1c8 = (Alloc *)local_2b0._M_pi;
  if (((ulong)local_2b0._M_pi & 7) == 0 && (Alloc *)local_2b0._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1c8 = (Alloc *)((long)(local_2b0._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    else {
      *(int *)&local_2b0._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_2b0._M_pi[3]._vptr__Sp_counted_base + 1;
    }
  }
  peStack_1c0 = local_418;
  local_1b8 = (Alloc *)_Var11._M_pi;
  if (((ulong)_Var11._M_pi & 7) == 0 && (Alloc *)_Var11._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1b8 = (Alloc *)((long)(_Var11._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    else {
      *(int *)&_Var11._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&_Var11._M_pi[3]._vptr__Sp_counted_base + 1;
    }
  }
  pAStack_1b0 = local_3d0;
  local_1a8 = (Alloc *)_Var14._M_pi;
  if (((ulong)_Var14._M_pi & 7) == 0 && (Alloc *)_Var14._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1a8 = (Alloc *)((long)(_Var14._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    else {
      *(int *)&_Var14._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&_Var14._M_pi[3]._vptr__Sp_counted_base + 1;
    }
  }
  _Stack_1a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3e8;
  local_198 = (Alloc *)_Var15._M_pi;
  if (((ulong)_Var15._M_pi & 7) == 0 && (Alloc *)_Var15._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_198 = (Alloc *)((long)(_Var15._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    else {
      *(int *)&_Var15._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&_Var15._M_pi[3]._vptr__Sp_counted_base + 1;
    }
  }
  _Stack_190._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_400;
  local_188 = local_3e0;
  if (((ulong)local_3e0 & 7) == 0 && local_3e0 != (element_type *)0x0) {
    if (entering_parallel == '\x01') {
      local_188 = (element_type *)
                  ((long)(local_3e0->parent_comm_).
                         super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr * 8 +
                  1);
    }
    else {
      *(int *)&local_3e0->items2content_[0].write_.shared_alloc_.alloc =
           *(int *)&local_3e0->items2content_[0].write_.shared_alloc_.alloc + 1;
    }
  }
  _Stack_180._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3a0;
  local_178 = local_3f8;
  if (((ulong)local_3f8 & 7) == 0 && local_3f8 != (element_type *)0x0) {
    if (entering_parallel == '\x01') {
      local_178 = (element_type *)
                  ((long)(local_3f8->parent_comm_).
                         super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr * 8 +
                  1);
    }
    else {
      *(int *)&local_3f8->items2content_[0].write_.shared_alloc_.alloc =
           *(int *)&local_3f8->items2content_[0].write_.shared_alloc_.alloc + 1;
    }
  }
  local_3f8 = local_178;
  _Stack_170._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3f0;
  local_168 = local_3b8;
  if (((ulong)local_3b8 & 7) == 0 && local_3b8 != (element_type *)0x0) {
    if (entering_parallel == '\x01') {
      local_168 = (element_type *)
                  ((long)(local_3b8->parent_comm_).
                         super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr * 8 +
                  1);
    }
    else {
      *(int *)&local_3b8->items2content_[0].write_.shared_alloc_.alloc =
           *(int *)&local_3b8->items2content_[0].write_.shared_alloc_.alloc + 1;
    }
  }
  _Stack_160._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pvVar10;
  local_158 = local_408;
  if (((ulong)local_408 & 7) == 0 && local_408 != (element_type *)0x0) {
    if (entering_parallel == '\x01') {
      local_158 = (element_type *)
                  ((long)(local_408->parent_comm_).
                         super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr * 8 +
                  1);
    }
    else {
      *(int *)&local_408->items2content_[0].write_.shared_alloc_.alloc =
           *(int *)&local_408->items2content_[0].write_.shared_alloc_.alloc + 1;
    }
  }
  local_408 = local_158;
  _Stack_150._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3a8;
  local_148 = local_410;
  if (((ulong)local_410 & 7) == 0 && local_410 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_148 = (Alloc *)(local_410->size * 8 + 1);
    }
    else {
      local_410->use_count = local_410->use_count + 1;
    }
  }
  local_410 = local_148;
  _Stack_140._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0;
  if (0 < LVar17) {
    local_398._8_8_ = local_3c0;
    local_398._0_8_ = local_1e8;
    if (((ulong)local_1e8 & 7) == 0 && local_1e8 != (Alloc *)0x0) {
      local_1e8->use_count = local_1e8->use_count + -1;
      local_398._0_8_ = local_1e8->size * 8 + 1;
    }
    local_1e8 = (Alloc *)0x0;
    peStack_1e0 = (element_type *)0x0;
    local_398._24_8_ = local_3c8;
    local_398._16_8_ = local_1d8;
    if (((ulong)local_1d8 & 7) == 0 && local_1d8 != (Alloc *)0x0) {
      local_1d8->use_count = local_1d8->use_count + -1;
      local_398._16_8_ = local_1d8->size * 8 + 1;
    }
    local_1d8 = (Alloc *)0x0;
    pAStack_1d0 = (Alloc *)0x0;
    local_370 = local_418;
    local_378 = local_1c8;
    if (((ulong)local_1c8 & 7) == 0 && local_1c8 != (Alloc *)0x0) {
      local_1c8->use_count = local_1c8->use_count + -1;
      local_378 = (Alloc *)(local_1c8->size * 8 + 1);
    }
    local_1c8 = (Alloc *)0x0;
    peStack_1c0 = (element_type *)0x0;
    local_360 = local_3d0;
    local_368 = local_1b8;
    if (((ulong)local_1b8 & 7) == 0 && local_1b8 != (Alloc *)0x0) {
      local_1b8->use_count = local_1b8->use_count + -1;
      local_368 = (Alloc *)(local_1b8->size * 8 + 1);
    }
    local_1b8 = (Alloc *)0x0;
    pAStack_1b0 = (Alloc *)0x0;
    local_350 = local_3e8;
    local_358 = local_1a8;
    if (((ulong)local_1a8 & 7) == 0 && local_1a8 != (Alloc *)0x0) {
      local_1a8->use_count = local_1a8->use_count + -1;
      local_358 = (Alloc *)(local_1a8->size * 8 + 1);
    }
    local_1a8 = (Alloc *)0x0;
    _Stack_1a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_340 = local_400;
    local_348 = local_198;
    if (((ulong)local_198 & 7) == 0 && local_198 != (Alloc *)0x0) {
      local_198->use_count = local_198->use_count + -1;
      local_348 = (Alloc *)(local_198->size * 8 + 1);
    }
    local_198 = (Alloc *)0x0;
    _Stack_190._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_330 = local_3a0;
    local_338 = local_188;
    if (((ulong)local_188 & 7) == 0 && local_188 != (element_type *)0x0) {
      *(int *)&local_188->items2content_[0].write_.shared_alloc_.alloc =
           *(int *)&local_188->items2content_[0].write_.shared_alloc_.alloc + -1;
      local_338 = (element_type *)
                  ((long)(local_188->parent_comm_).
                         super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr * 8 +
                  1);
    }
    local_188 = (element_type *)0x0;
    _Stack_180._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_328 = local_178;
    local_320 = local_3f0;
    if (((ulong)local_178 & 7) == 0 && local_178 != (element_type *)0x0) {
      *(int *)&local_178->items2content_[0].write_.shared_alloc_.alloc =
           *(int *)&local_178->items2content_[0].write_.shared_alloc_.alloc + -1;
      local_328 = (element_type *)
                  ((long)(local_178->parent_comm_).
                         super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr * 8 +
                  1);
    }
    local_178 = (element_type *)0x0;
    _Stack_170._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_310 = (Alloc *)pvVar10;
    local_318 = local_168;
    if (((ulong)local_168 & 7) == 0 && local_168 != (element_type *)0x0) {
      *(int *)&local_168->items2content_[0].write_.shared_alloc_.alloc =
           *(int *)&local_168->items2content_[0].write_.shared_alloc_.alloc + -1;
      local_318 = (element_type *)
                  ((long)(local_168->parent_comm_).
                         super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr * 8 +
                  1);
    }
    local_168 = (element_type *)0x0;
    _Stack_160._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_308 = local_158;
    local_300._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3a8;
    if (((ulong)local_158 & 7) == 0 && local_158 != (element_type *)0x0) {
      *(int *)&local_158->items2content_[0].write_.shared_alloc_.alloc =
           *(int *)&local_158->items2content_[0].write_.shared_alloc_.alloc + -1;
      local_308 = (element_type *)
                  ((long)(local_158->parent_comm_).
                         super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr * 8 +
                  1);
    }
    local_158 = (element_type *)0x0;
    _Stack_150._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_2f8 = local_148;
    local_2f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0;
    if (((ulong)local_148 & 7) == 0 && local_148 != (Alloc *)0x0) {
      local_148->use_count = local_148->use_count + -1;
      local_2f8 = (Alloc *)(local_148->size * 8 + 1);
    }
    local_148 = (Alloc *)0x0;
    _Stack_140._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    entering_parallel = '\0';
    lVar18 = 0;
    do {
      iVar6 = *(int *)((long)&(((Graph *)&local_3c0->library_)->a2ab).write_.shared_alloc_.alloc +
                      lVar18 * 4);
      iVar7 = *(int *)((long)&(((Graph *)&local_3c0->library_)->a2ab).write_.shared_alloc_.alloc +
                      lVar18 * 4 + 4);
      if (iVar6 < iVar7) {
        pAVar25 = (Alloc *)0xffffffffffffffff;
        lVar22 = 0;
        bVar20 = false;
        pLVar27 = (Library *)0xbff0000000000000;
        pAVar26 = (Alloc *)0xbff0000000000000;
        do {
          lVar24 = (long)*(int *)((long)&(((Graph *)&local_3c8->size)->a2ab).write_.shared_alloc_.
                                         alloc + lVar22 * 4 + (long)iVar6 * 4);
          iVar8 = *(int *)((long)&(local_418->super_Graph).a2ab.write_.shared_alloc_.alloc +
                          lVar24 * 4);
          if ((long)iVar8 != -1) {
            cVar5 = *(char *)((long)&(local_3e8->super_Graph).a2ab.write_.shared_alloc_.alloc +
                             (long)iVar8);
            if (cVar5 == '\0') {
              uVar19 = 0x2a;
              pcVar21 = "cand_code != DONT_COLLAPSE";
              goto LAB_00266470;
            }
            uVar23 = (uint)(*(char *)((long)&(((Graph *)&local_3d0->size)->a2ab).write_.
                                             shared_alloc_.alloc + lVar22 + iVar6) >> 3);
            if (((uint)(int)cVar5 >> (uVar23 & 0x1f) & 1) != 0) {
              pLVar3 = (&local_3a0->library_)[lVar24];
              pAVar4 = (&(((Graph *)&local_3f0->size)->a2ab).write_.shared_alloc_.alloc)
                       [(int)(uVar23 + iVar8 * 2)];
              if ((pAVar25 != (Alloc *)0xffffffffffffffff) && ((double)pLVar27 <= (double)pLVar3)) {
                if (((double)pLVar3 != (double)pLVar27) ||
                   ((NAN((double)pLVar3) || NAN((double)pLVar27) ||
                    ((double)pAVar4 <= (double)pAVar26)))) goto LAB_00265b3a;
              }
              bVar20 = true;
              pAVar25 = (&(((Graph *)&local_400->library_)->a2ab).write_.shared_alloc_.alloc)
                        [lVar24];
              pAVar26 = pAVar4;
              pLVar27 = pLVar3;
            }
          }
LAB_00265b3a:
          lVar22 = lVar22 + 1;
        } while (iVar7 - iVar6 != (int)lVar22);
        *(bool *)((long)(_func_int ***)pvVar10 + lVar18) = bVar20;
        if ((bVar20) && (pAVar25 == (Alloc *)0xffffffffffffffff)) {
          uVar19 = 0x38;
          pcVar21 = "best_global != -1";
LAB_00266470:
          fail("assertion %s failed at %s +%d\n",pcVar21,
               "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_collapse_rail.cpp"
               ,uVar19);
        }
      }
      else {
        *(undefined1 *)((long)(_func_int ***)pvVar10 + lVar18) = 0;
        pAVar25 = (Alloc *)0xffffffffffffffff;
        pAVar26 = (Alloc *)0xbff0000000000000;
      }
      (&local_3a8->size)[lVar18] = (size_t)pAVar26;
      (&local_3b0->size)[lVar18] = (size_t)pAVar25;
      lVar18 = lVar18 + 1;
    } while (LVar17 != (int)lVar18);
    choose_rails(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<signed_char>,Omega_h::Read<double>,Omega_h::Read<signed_char>*,Omega_h::Read<double>*,Omega_h::Read<long>*)
    ::$_0::~__0((__0 *)local_398);
  }
  choose_rails(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<signed_char>,Omega_h::Read<double>,Omega_h::Read<signed_char>*,Omega_h::Read<double>*,Omega_h::Read<long>*)
  ::$_0::~__0((__0 *)&local_1e8);
  _Var11._M_pi = local_130._M_pi;
  peVar12 = local_138;
  pMVar9 = local_3d8;
  local_248.shared_alloc_.alloc = local_2c0.shared_alloc_.alloc;
  if (((ulong)local_2c0.shared_alloc_.alloc & 7) == 0 &&
      local_2c0.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_248.shared_alloc_.alloc = (Alloc *)((long)(local_2c0.shared_alloc_.alloc)->size * 8 + 1)
      ;
    }
    else {
      *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)local_2c0.shared_alloc_.alloc + 0x30))->_vptr__Sp_counted_base =
           *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)local_2c0.shared_alloc_.alloc + 0x30))->_vptr__Sp_counted_base + 1;
    }
  }
  local_248.shared_alloc_.direct_ptr = local_2c0.shared_alloc_.direct_ptr;
  Read<signed_char>::Read((Read<signed_char> *)local_398,&local_248);
  pAVar26 = (((Write<signed_char> *)&(_Var11._M_pi)->_vptr__Sp_counted_base)->shared_alloc_).alloc;
  if (((ulong)pAVar26 & 7) == 0 && pAVar26 != (Alloc *)0x0) {
    piVar1 = &pAVar26->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar26);
      operator_delete(pAVar26,0x48);
    }
  }
  (((Write<signed_char> *)&(_Var11._M_pi)->_vptr__Sp_counted_base)->shared_alloc_).alloc =
       (Alloc *)local_398._0_8_;
  *(undefined8 *)&(_Var11._M_pi)->_M_use_count = local_398._8_8_;
  local_258 = (Alloc *)local_398._0_8_;
  if (((local_398._0_8_ & 7) == 0 && (Alloc *)local_398._0_8_ != (Alloc *)0x0) &&
     (entering_parallel == '\x01')) {
    *(int *)(local_398._0_8_ + 0x30) = *(int *)(local_398._0_8_ + 0x30) + -1;
    local_258 = (Alloc *)(*(long *)local_398._0_8_ * 8 + 1);
    (((Write<signed_char> *)&(_Var11._M_pi)->_vptr__Sp_counted_base)->shared_alloc_).alloc =
         local_258;
  }
  pAVar26 = local_248.shared_alloc_.alloc;
  local_398._0_8_ = (Alloc *)0x0;
  local_398._8_8_ = (element_type *)0x0;
  if (((ulong)local_248.shared_alloc_.alloc & 7) == 0 &&
      local_248.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_248.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_248.shared_alloc_.alloc);
      operator_delete(pAVar26,0x48);
      local_258 = (((Write<signed_char> *)&(_Var11._M_pi)->_vptr__Sp_counted_base)->shared_alloc_).
                  alloc;
    }
  }
  if (((ulong)local_258 & 7) == 0 && local_258 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_258 = (Alloc *)(local_258->size * 8 + 1);
    }
    else {
      local_258->use_count = local_258->use_count + 1;
    }
  }
  local_250._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(_Var11._M_pi)->_M_use_count;
  ent_dim = (Int)pMVar9;
  Mesh::sync_array<signed_char>((Mesh *)local_398,ent_dim,(Read<signed_char> *)0x0,(Int)&local_258);
  pAVar26 = (((Write<signed_char> *)&(_Var11._M_pi)->_vptr__Sp_counted_base)->shared_alloc_).alloc;
  if (((ulong)pAVar26 & 7) == 0 && pAVar26 != (Alloc *)0x0) {
    piVar1 = &pAVar26->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar26);
      operator_delete(pAVar26,0x48);
    }
  }
  pAVar26 = local_258;
  (((Write<signed_char> *)&(_Var11._M_pi)->_vptr__Sp_counted_base)->shared_alloc_).alloc =
       (Alloc *)local_398._0_8_;
  *(undefined8 *)&(_Var11._M_pi)->_M_use_count = local_398._8_8_;
  if (((local_398._0_8_ & 7) == 0 && (Alloc *)local_398._0_8_ != (Alloc *)0x0) &&
     (entering_parallel == '\x01')) {
    *(int *)(local_398._0_8_ + 0x30) = *(int *)(local_398._0_8_ + 0x30) + -1;
    (((Write<signed_char> *)&(_Var11._M_pi)->_vptr__Sp_counted_base)->shared_alloc_).alloc =
         (Alloc *)(*(long *)local_398._0_8_ * 8 + 1);
  }
  local_398._0_8_ = (Alloc *)0x0;
  local_398._8_8_ = (element_type *)0x0;
  if (((ulong)local_258 & 7) == 0 && local_258 != (Alloc *)0x0) {
    piVar1 = &local_258->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar26);
      operator_delete(pAVar26,0x48);
    }
  }
  local_268.shared_alloc_.alloc = local_2d0.shared_alloc_.alloc;
  if (((ulong)local_2d0.shared_alloc_.alloc & 7) == 0 &&
      local_2d0.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_268.shared_alloc_.alloc = (Alloc *)((long)(local_2d0.shared_alloc_.alloc)->size * 8 + 1)
      ;
    }
    else {
      *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)local_2d0.shared_alloc_.alloc + 0x30))->_vptr__Sp_counted_base =
           *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)local_2d0.shared_alloc_.alloc + 0x30))->_vptr__Sp_counted_base + 1;
    }
  }
  local_268.shared_alloc_.direct_ptr = local_2d0.shared_alloc_.direct_ptr;
  Read<double>::Read((Read<signed_char> *)local_398,&local_268);
  pAVar26 = ((SharedAlloc *)&(peVar12->super_Graph).a2ab)->alloc;
  if (((ulong)pAVar26 & 7) == 0 && pAVar26 != (Alloc *)0x0) {
    piVar1 = &pAVar26->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar26);
      operator_delete(pAVar26,0x48);
    }
  }
  pAVar26 = local_268.shared_alloc_.alloc;
  ((SharedAlloc *)&(peVar12->super_Graph).a2ab)->alloc = (Alloc *)local_398._0_8_;
  ((SharedAlloc *)&(peVar12->super_Graph).a2ab)->direct_ptr = (void *)local_398._8_8_;
  local_278 = (Alloc *)local_398._0_8_;
  if (((local_398._0_8_ & 7) == 0 && (Alloc *)local_398._0_8_ != (Alloc *)0x0) &&
     (entering_parallel == '\x01')) {
    *(int *)(local_398._0_8_ + 0x30) = *(int *)(local_398._0_8_ + 0x30) + -1;
    local_278 = (Alloc *)(*(long *)local_398._0_8_ * 8 + 1);
    ((SharedAlloc *)&(peVar12->super_Graph).a2ab)->alloc = local_278;
  }
  local_398._0_8_ = (Alloc *)0x0;
  local_398._8_8_ = (element_type *)0x0;
  if (((ulong)local_268.shared_alloc_.alloc & 7) == 0 &&
      local_268.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_268.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_268.shared_alloc_.alloc);
      operator_delete(pAVar26,0x48);
      local_278 = ((SharedAlloc *)&(peVar12->super_Graph).a2ab)->alloc;
    }
  }
  if (((ulong)local_278 & 7) == 0 && local_278 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_278 = (Alloc *)(local_278->size * 8 + 1);
    }
    else {
      local_278->use_count = local_278->use_count + 1;
    }
  }
  local_270._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       ((SharedAlloc *)&(peVar12->super_Graph).a2ab)->direct_ptr;
  Mesh::sync_array<double>((Mesh *)local_398,ent_dim,(Read<double> *)0x0,(Int)&local_278);
  pAVar26 = ((SharedAlloc *)&(peVar12->super_Graph).a2ab)->alloc;
  if (((ulong)pAVar26 & 7) == 0 && pAVar26 != (Alloc *)0x0) {
    piVar1 = &pAVar26->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar26);
      operator_delete(pAVar26,0x48);
    }
  }
  pAVar26 = local_278;
  ((SharedAlloc *)&(peVar12->super_Graph).a2ab)->alloc = (Alloc *)local_398._0_8_;
  ((SharedAlloc *)&(peVar12->super_Graph).a2ab)->direct_ptr = (void *)local_398._8_8_;
  if (((local_398._0_8_ & 7) == 0 && (Alloc *)local_398._0_8_ != (Alloc *)0x0) &&
     (entering_parallel == '\x01')) {
    *(int *)(local_398._0_8_ + 0x30) = *(int *)(local_398._0_8_ + 0x30) + -1;
    ((SharedAlloc *)&(peVar12->super_Graph).a2ab)->alloc =
         (Alloc *)(*(long *)local_398._0_8_ * 8 + 1);
  }
  local_398._0_8_ = (Alloc *)0x0;
  local_398._8_8_ = (element_type *)0x0;
  if (((ulong)local_278 & 7) == 0 && local_278 != (Alloc *)0x0) {
    piVar1 = &local_278->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_278);
      operator_delete(pAVar26,0x48);
    }
  }
  local_288.shared_alloc_.alloc = local_2e0.shared_alloc_.alloc;
  if (((ulong)local_2e0.shared_alloc_.alloc & 7) == 0 &&
      local_2e0.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_288.shared_alloc_.alloc = (Alloc *)((long)(local_2e0.shared_alloc_.alloc)->size * 8 + 1)
      ;
    }
    else {
      *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)local_2e0.shared_alloc_.alloc + 0x30))->_vptr__Sp_counted_base =
           *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)local_2e0.shared_alloc_.alloc + 0x30))->_vptr__Sp_counted_base + 1;
    }
  }
  local_288.shared_alloc_.direct_ptr = local_2e0.shared_alloc_.direct_ptr;
  Read<long>::Read((Read<signed_char> *)local_398,&local_288);
  pAVar26 = (vert_rails->write_).shared_alloc_.alloc;
  if (((ulong)pAVar26 & 7) == 0 && pAVar26 != (Alloc *)0x0) {
    piVar1 = &pAVar26->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar26);
      operator_delete(pAVar26,0x48);
    }
  }
  pAVar26 = local_288.shared_alloc_.alloc;
  (vert_rails->write_).shared_alloc_.alloc = (Alloc *)local_398._0_8_;
  (vert_rails->write_).shared_alloc_.direct_ptr = (void *)local_398._8_8_;
  local_298 = (Alloc *)local_398._0_8_;
  if (((local_398._0_8_ & 7) == 0 && (Alloc *)local_398._0_8_ != (Alloc *)0x0) &&
     (entering_parallel == '\x01')) {
    *(int *)(local_398._0_8_ + 0x30) = *(int *)(local_398._0_8_ + 0x30) + -1;
    local_298 = (Alloc *)(*(long *)local_398._0_8_ * 8 + 1);
    (vert_rails->write_).shared_alloc_.alloc = local_298;
  }
  local_398._0_8_ = (Alloc *)0x0;
  local_398._8_8_ = (element_type *)0x0;
  if (((ulong)local_288.shared_alloc_.alloc & 7) == 0 &&
      local_288.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_288.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_288.shared_alloc_.alloc);
      operator_delete(pAVar26,0x48);
      local_298 = (vert_rails->write_).shared_alloc_.alloc;
    }
  }
  if (((ulong)local_298 & 7) == 0 && local_298 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_298 = (Alloc *)(local_298->size * 8 + 1);
    }
    else {
      local_298->use_count = local_298->use_count + 1;
    }
  }
  local_290._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(vert_rails->write_).shared_alloc_.direct_ptr
  ;
  Mesh::sync_array<long>((Mesh *)local_398,ent_dim,(Read<long> *)0x0,(Int)&local_298);
  pAVar26 = (vert_rails->write_).shared_alloc_.alloc;
  if (((ulong)pAVar26 & 7) == 0 && pAVar26 != (Alloc *)0x0) {
    piVar1 = &pAVar26->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar26);
      operator_delete(pAVar26,0x48);
    }
  }
  pAVar26 = local_298;
  (vert_rails->write_).shared_alloc_.alloc = (Alloc *)local_398._0_8_;
  (vert_rails->write_).shared_alloc_.direct_ptr = (void *)local_398._8_8_;
  if (((local_398._0_8_ & 7) == 0 && (Alloc *)local_398._0_8_ != (Alloc *)0x0) &&
     (entering_parallel == '\x01')) {
    *(int *)(local_398._0_8_ + 0x30) = *(int *)(local_398._0_8_ + 0x30) + -1;
    (vert_rails->write_).shared_alloc_.alloc = (Alloc *)(*(long *)local_398._0_8_ * 8 + 1);
  }
  local_398._0_8_ = (pointer)0x0;
  local_398._8_8_ = (element_type *)0x0;
  if (((ulong)local_298 & 7) == 0 && local_298 != (Alloc *)0x0) {
    piVar1 = &local_298->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_298);
      operator_delete(pAVar26,0x48);
    }
  }
  choose_rails(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<signed_char>,Omega_h::Read<double>,Omega_h::Read<signed_char>*,Omega_h::Read<double>*,Omega_h::Read<long>*)
  ::$_0::~__0((__0 *)&local_120);
  if (((ulong)local_2e0.shared_alloc_.alloc & 7) == 0 &&
      local_2e0.shared_alloc_.alloc != (Alloc *)0x0) {
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             ((long)local_2e0.shared_alloc_.alloc + 0x30);
    *(int *)&p_Var2->_vptr__Sp_counted_base = *(int *)&p_Var2->_vptr__Sp_counted_base + -1;
    if (*(int *)&p_Var2->_vptr__Sp_counted_base == 0) {
      Alloc::~Alloc(local_2e0.shared_alloc_.alloc);
      operator_delete(local_2e0.shared_alloc_.alloc,0x48);
    }
  }
  if (((ulong)local_2d0.shared_alloc_.alloc & 7) == 0 &&
      local_2d0.shared_alloc_.alloc != (Alloc *)0x0) {
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             ((long)local_2d0.shared_alloc_.alloc + 0x30);
    *(int *)&p_Var2->_vptr__Sp_counted_base = *(int *)&p_Var2->_vptr__Sp_counted_base + -1;
    if (*(int *)&p_Var2->_vptr__Sp_counted_base == 0) {
      Alloc::~Alloc(local_2d0.shared_alloc_.alloc);
      operator_delete(local_2d0.shared_alloc_.alloc,0x48);
    }
  }
  if (((ulong)local_2c0.shared_alloc_.alloc & 7) == 0 &&
      local_2c0.shared_alloc_.alloc != (Alloc *)0x0) {
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             ((long)local_2c0.shared_alloc_.alloc + 0x30);
    *(int *)&p_Var2->_vptr__Sp_counted_base = *(int *)&p_Var2->_vptr__Sp_counted_base + -1;
    if (*(int *)&p_Var2->_vptr__Sp_counted_base == 0) {
      Alloc::~Alloc(local_2c0.shared_alloc_.alloc);
      operator_delete(local_2c0.shared_alloc_.alloc,0x48);
    }
  }
  if (((ulong)local_238 & 7) == 0 && local_238 != (Alloc *)0x0) {
    piVar1 = &local_238->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_238);
      operator_delete(local_238,0x48);
    }
  }
  if (((ulong)local_228._M_pi & 7) == 0 && (Alloc *)local_228._M_pi != (Alloc *)0x0) {
    p_Var2 = local_228._M_pi + 3;
    *(int *)&p_Var2->_vptr__Sp_counted_base = *(int *)&p_Var2->_vptr__Sp_counted_base + -1;
    if (*(int *)&p_Var2->_vptr__Sp_counted_base == 0) {
      Alloc::~Alloc((Alloc *)local_228._M_pi);
      operator_delete(local_228._M_pi,0x48);
    }
  }
  if (((ulong)local_70._M_pi & 7) == 0 && (Alloc *)local_70._M_pi != (Alloc *)0x0) {
    p_Var2 = local_70._M_pi + 3;
    *(int *)&p_Var2->_vptr__Sp_counted_base = *(int *)&p_Var2->_vptr__Sp_counted_base + -1;
    if (*(int *)&p_Var2->_vptr__Sp_counted_base == 0) {
      Alloc::~Alloc((Alloc *)local_70._M_pi);
      operator_delete(local_70._M_pi,0x48);
    }
  }
  _Var11._M_pi = local_218._M_pi;
  if (((ulong)local_218._M_pi & 7) == 0 && (Alloc *)local_218._M_pi != (Alloc *)0x0) {
    p_Var2 = local_218._M_pi + 3;
    *(int *)&p_Var2->_vptr__Sp_counted_base = *(int *)&p_Var2->_vptr__Sp_counted_base + -1;
    if (*(int *)&p_Var2->_vptr__Sp_counted_base == 0) {
      Alloc::~Alloc((Alloc *)local_218._M_pi);
      operator_delete(_Var11._M_pi,0x48);
    }
  }
  pAVar26 = local_208;
  if (((ulong)local_208 & 7) == 0 && local_208 != (Alloc *)0x0) {
    piVar1 = &local_208->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_208);
      operator_delete(pAVar26,0x48);
    }
  }
  pAVar26 = local_1f8;
  if (((ulong)local_1f8 & 7) == 0 && local_1f8 != (Alloc *)0x0) {
    piVar1 = &local_1f8->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_1f8);
      operator_delete(pAVar26,0x48);
    }
  }
  Adj::~Adj(&local_60);
  if (((ulong)local_420 & 7) == 0 && local_420 != (Alloc *)0x0) {
    piVar1 = &local_420->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_420);
      operator_delete(local_420,0x48);
    }
  }
  return;
}

Assistant:

void choose_rails(Mesh* mesh, LOs cands2edges, Read<I8> cand_edge_codes,
    Reals cand_edge_quals, Read<I8>* verts_are_cands, Reals* vert_quals,
    Read<GO>* vert_rails) {
  OMEGA_H_CHECK(mesh->parting() == OMEGA_H_GHOSTED);
  auto edges2cands = invert_injective_map(cands2edges, mesh->nedges());
  auto v2e = mesh->ask_up(VERT, EDGE);
  auto v2ve = v2e.a2ab;
  auto ve2e = v2e.ab2b;
  auto ve_codes = v2e.codes;
  auto ev2v = mesh->ask_verts_of(EDGE);
  auto lengths = mesh->ask_lengths();
  auto globals = mesh->globals(EDGE);
  auto verts_are_cands_w = Write<I8>(mesh->nverts());
  auto vert_quals_w = Write<Real>(mesh->nverts());
  auto vert_rails_w = Write<GO>(mesh->nverts());
  auto f = OMEGA_H_LAMBDA(LO v) {
    bool vert_is_cand = false;
    GO best_global = -1;
    Real best_length = -1;
    Real best_qual = -1;
    for (auto ve = v2ve[v]; ve < v2ve[v + 1]; ++ve) {
      auto e = ve2e[ve];
      auto cand = edges2cands[e];
      if (cand == -1) continue;
      auto ve_code = ve_codes[ve];
      auto eev = code_which_down(ve_code);
      auto cand_code = cand_edge_codes[cand];
      OMEGA_H_CHECK(cand_code != DONT_COLLAPSE);
      if (!collapses(cand_code, eev)) continue;
      auto global = globals[e];
      auto length = lengths[e];
      auto qual = cand_edge_quals[cand * 2 + eev];
      if ((best_global == -1) || (length < best_length) ||
          ((length == best_length) && (qual > best_qual))) {
        vert_is_cand = true;
        best_global = global;
        best_length = length;
        best_qual = qual;
      }
    }
    verts_are_cands_w[v] = vert_is_cand;
    if (vert_is_cand) OMEGA_H_CHECK(best_global != -1);
    vert_quals_w[v] = best_qual;
    vert_rails_w[v] = best_global;
  };
  parallel_for(mesh->nverts(), f, "choose_rails");
  *verts_are_cands = verts_are_cands_w;
  *verts_are_cands = mesh->sync_array(VERT, *verts_are_cands, 1);
  *vert_quals = vert_quals_w;
  *vert_quals = mesh->sync_array(VERT, *vert_quals, 1);
  *vert_rails = vert_rails_w;
  *vert_rails = mesh->sync_array(VERT, *vert_rails, 1);
}